

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

int cuddEstimateCofactor(DdManager *dd,st__table *table,DdNode *node,int i,int phase,DdNode **ptr)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  DdNode *ptrT;
  DdNode *ptrE;
  
  if (((ulong)node->next & 1) == 0) {
    node->next = (DdNode *)((ulong)node->next | 1);
    uVar1 = node->index;
    if ((ulong)uVar1 == 0x7fffffff) {
      *ptr = node;
      iVar2 = st__add_direct(table,(char *)node,(char *)node);
      return (uint)(iVar2 != -10000) * 2 + -1;
    }
    if (uVar1 == i) {
      if (phase == 1) {
        pDVar6 = (node->type).kids.T;
        *ptr = pDVar6;
      }
      else {
        pDVar6 = (node->type).kids.E;
        *ptr = pDVar6;
        pDVar6 = (DdNode *)((ulong)pDVar6 & 0xfffffffffffffffe);
      }
      iVar2 = ddDagInt(pDVar6);
      if (node->ref < 2) {
        return iVar2;
      }
      ptrT = *ptr;
    }
    else {
      if (dd->perm[i] < dd->perm[uVar1]) {
        *ptr = node;
        iVar2 = ddDagInt((node->type).kids.T);
        iVar4 = ddDagInt((DdNode *)((ulong)(node->type).kids.E & 0xfffffffffffffffe));
        if ((1 < node->ref) &&
           (iVar3 = st__add_direct(table,(char *)node,(char *)node), iVar3 == -10000)) {
          return -1;
        }
        return iVar4 + iVar2 + 1;
      }
      iVar2 = cuddEstimateCofactor(dd,table,(node->type).kids.T,i,phase,&ptrT);
      iVar4 = cuddEstimateCofactor
                        (dd,table,(DdNode *)((ulong)(node->type).kids.E & 0xfffffffffffffffe),i,
                         phase,&ptrE);
      pDVar6 = (node->type).kids.E;
      pDVar5 = (DdNode *)((ulong)((uint)pDVar6 & 1) ^ (ulong)ptrE);
      if (ptrT != pDVar5) {
        if (((pDVar6 != pDVar5) || (ptrT != (node->type).kids.T)) && ((int)node->index < dd->size))
        {
          for (pDVar6 = dd->subtables[(uint)dd->perm[(int)node->index]].nodelist
                        [(int)((((uint)pDVar5 & 1) +
                                *(int *)(((ulong)ptrE & 0xfffffffffffffffe) + 0x20) * 2 +
                               (((uint)ptrT & 1) +
                               *(int *)(((ulong)ptrT & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005)
                               * 0x40f1f9 >>
                              ((byte)dd->subtables[(uint)dd->perm[(int)node->index]].shift & 0x1f))]
              ; pDVar7 = (pDVar6->type).kids.T, ptrT < pDVar7;
              pDVar6 = (DdNode *)((ulong)pDVar6->next & 0xfffffffffffffffe)) {
          }
          while (pDVar7 == ptrT) {
            pDVar7 = (pDVar6->type).kids.E;
            if (pDVar7 <= pDVar5) {
              if (pDVar7 == pDVar5) {
                *ptr = pDVar6;
                iVar2 = iVar2 + 1 + iVar4;
                if (((ulong)pDVar6->next & 1) != 0) {
                  iVar2 = 0;
                }
                ptrT = pDVar6;
                ptrE = pDVar5;
                if (node->ref < 2) {
                  return iVar2;
                }
                goto LAB_0066eab6;
              }
              break;
            }
            pDVar6 = (DdNode *)((ulong)pDVar6->next & 0xfffffffffffffffe);
            pDVar7 = (pDVar6->type).kids.T;
          }
        }
        *ptr = node;
        return iVar2 + iVar4 + 1;
      }
      *ptr = ptrT;
      ptrE = pDVar5;
      if (node->ref < 2) {
        return iVar2;
      }
    }
LAB_0066eab6:
    iVar4 = st__add_direct(table,(char *)node,(char *)ptrT);
    if (iVar4 != -10000) {
      return iVar2;
    }
  }
  else {
    iVar2 = st__lookup(table,(char *)node,(char **)ptr);
    if (iVar2 != 0) {
      return 0;
    }
    iVar2 = st__add_direct(table,(char *)node,(char *)node);
    if (iVar2 != -10000) {
      *ptr = node;
      return 0;
    }
  }
  return -1;
}

Assistant:

static int
cuddEstimateCofactor(
  DdManager *dd,
  st__table *table,
  DdNode * node,
  int i,
  int phase,
  DdNode ** ptr)
{
    int tval, eval, val;
    DdNode *ptrT, *ptrE;

    if (Cudd_IsComplement(node->next)) {
        if (! st__lookup(table,(char *)node,(char **)ptr)) {
            if ( st__add_direct(table,(char *)node,(char *)node) ==
                st__OUT_OF_MEM)
                return(CUDD_OUT_OF_MEM);
            *ptr = node;
        }
        return(0);
    }
    node->next = Cudd_Not(node->next);
    if (cuddIsConstant(node)) {
        *ptr = node;
        if ( st__add_direct(table,(char *)node,(char *)node) == st__OUT_OF_MEM)
            return(CUDD_OUT_OF_MEM);
        return(1);
    }
    if ((int) node->index == i) {
        if (phase == 1) {
            *ptr = cuddT(node);
            val = ddDagInt(cuddT(node));
        } else {
            *ptr = cuddE(node);
            val = ddDagInt(Cudd_Regular(cuddE(node)));
        }
        if (node->ref > 1) {
            if ( st__add_direct(table,(char *)node,(char *)*ptr) ==
                st__OUT_OF_MEM)
                return(CUDD_OUT_OF_MEM);
        }
        return(val);
    }
    if (dd->perm[node->index] > dd->perm[i]) {
        *ptr = node;
        tval = ddDagInt(cuddT(node));
        eval = ddDagInt(Cudd_Regular(cuddE(node)));
        if (node->ref > 1) {
            if ( st__add_direct(table,(char *)node,(char *)node) ==
                st__OUT_OF_MEM)
                return(CUDD_OUT_OF_MEM);
        }
        val = 1 + tval + eval;
        return(val);
    }
    tval = cuddEstimateCofactor(dd,table,cuddT(node),i,phase,&ptrT);
    eval = cuddEstimateCofactor(dd,table,Cudd_Regular(cuddE(node)),i,
                                phase,&ptrE);
    ptrE = Cudd_NotCond(ptrE,Cudd_IsComplement(cuddE(node)));
    if (ptrT == ptrE) {         /* recombination */
        *ptr = ptrT;
        val = tval;
        if (node->ref > 1) {
            if ( st__add_direct(table,(char *)node,(char *)*ptr) ==
                    st__OUT_OF_MEM)
                return(CUDD_OUT_OF_MEM);
        }
    } else if ((ptrT != cuddT(node) || ptrE != cuddE(node)) &&
               (*ptr = cuddUniqueLookup(dd,node->index,ptrT,ptrE)) != NULL) {
        if (Cudd_IsComplement((*ptr)->next)) {
            val = 0;
        } else {
            val = 1 + tval + eval;
        }
        if (node->ref > 1) {
            if ( st__add_direct(table,(char *)node,(char *)*ptr) ==
                    st__OUT_OF_MEM)
                return(CUDD_OUT_OF_MEM);
        }
    } else {
        *ptr = node;
        val = 1 + tval + eval;
    }
    return(val);

}